

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_algs.h
# Opt level: O1

float CB_ALGS::get_cost_pred<false>
                (single_learner *scorer,cb_class *known_cost,example *ec,uint32_t index,
                uint32_t base)

{
  uint64_t *puVar1;
  label_t lVar2;
  wclass *pwVar3;
  wclass *pwVar4;
  size_t sVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  size_t sVar9;
  bool bVar10;
  int iVar11;
  float fVar12;
  polyprediction p;
  label ld;
  
  lVar2 = (ec->l).multi;
  pwVar3 = (ec->l).cs.costs._end;
  pwVar4 = (ec->l).cs.costs.end_array;
  sVar5 = (ec->l).cs.costs.erase_count;
  fVar12 = 3.4028235e+38;
  if ((known_cost != (cb_class *)0x0) && (known_cost->action == index)) {
    fVar12 = known_cost->cost;
  }
  bVar10 = BASELINE::baseline_enabled(ec);
  BASELINE::set_baseline_enabled(ec);
  (ec->l).multi.label = (uint32_t)fVar12;
  (ec->l).simple.initial = 0.0;
  pfVar6 = (ec->pred).scalars._begin;
  pfVar7 = (ec->pred).scalars._end;
  pfVar8 = (ec->pred).scalars.end_array;
  sVar9 = (ec->pred).scalars.erase_count;
  iVar11 = index + base + -1;
  puVar1 = &(ec->super_example_predict).ft_offset;
  *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(scorer + 0xe0) * iVar11);
  (**(code **)(scorer + 0x30))(*(undefined8 *)(scorer + 0x18),*(undefined8 *)(scorer + 0x20),ec);
  puVar1 = &(ec->super_example_predict).ft_offset;
  *puVar1 = *puVar1 - (ulong)(uint)(iVar11 * *(int *)(scorer + 0xe0));
  if (!bVar10) {
    BASELINE::reset_baseline_disabled(ec);
  }
  fVar12 = (ec->pred).scalar;
  (ec->pred).scalars.end_array = pfVar8;
  (ec->pred).scalars.erase_count = sVar9;
  (ec->pred).scalars._begin = pfVar6;
  (ec->pred).scalars._end = pfVar7;
  (ec->l).cs.costs.end_array = pwVar4;
  (ec->l).cs.costs.erase_count = sVar5;
  (ec->l).multi = lVar2;
  (ec->l).cs.costs._end = pwVar3;
  return fVar12;
}

Assistant:

float get_cost_pred(
    LEARNER::single_learner* scorer, CB::cb_class* known_cost, example& ec, uint32_t index, uint32_t base)
{
  CB::label ld = ec.l.cb;

  label_data simple_temp;
  simple_temp.initial = 0.;
  if (known_cost != nullptr && index == known_cost->action)
    simple_temp.label = known_cost->cost;
  else
    simple_temp.label = FLT_MAX;

  const bool baseline_enabled_old = BASELINE::baseline_enabled(&ec);
  BASELINE::set_baseline_enabled(&ec);
  ec.l.simple = simple_temp;
  polyprediction p = ec.pred;
  if (is_learn && known_cost != nullptr && index == known_cost->action)
  {
    float old_weight = ec.weight;
    ec.weight /= known_cost->probability;
    scorer->learn(ec, index - 1 + base);
    ec.weight = old_weight;
  }
  else
    scorer->predict(ec, index - 1 + base);

  if (!baseline_enabled_old)
    BASELINE::reset_baseline_disabled(&ec);
  float pred = ec.pred.scalar;
  ec.pred = p;

  ec.l.cb = ld;

  return pred;
}